

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ReduceSumLayerParams::Clear(ReduceSumLayerParams *this)

{
  ReduceSumLayerParams *this_local;
  
  google::protobuf::RepeatedField<long>::Clear(&this->axes_);
  memset(&this->keepdims_,0,2);
  return;
}

Assistant:

void ReduceSumLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ReduceSumLayerParams)
  axes_.Clear();
  ::memset(&keepdims_, 0, reinterpret_cast<char*>(&reduceall_) -
    reinterpret_cast<char*>(&keepdims_) + sizeof(reduceall_));
}